

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat __thiscall Mat::operator~(Mat *this)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  uint *in_RSI;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  Mat MVar10;
  
  Mat(this,in_RSI[1],*in_RSI);
  uVar1 = in_RSI[1];
  pdVar4 = this->v_;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  uVar3 = (ulong)*in_RSI;
  if ((int)*in_RSI < 1) {
    uVar3 = uVar5;
  }
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    lVar2 = *(long *)(in_RSI + 2);
    pdVar8 = pdVar4;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      *pdVar8 = *(double *)(lVar2 + uVar5 + uVar9 * 8);
      pdVar8 = pdVar8 + (int)uVar1;
    }
    uVar5 = uVar5 + (long)(int)uVar1 * 8;
    pdVar4 = pdVar4 + 1;
  }
  MVar10.v_ = pdVar4;
  MVar10._0_8_ = this;
  return MVar10;
}

Assistant:

Mat Mat::operator~()
{
	Mat transpose(n_cols_, n_rows_);
	for (int i=0; i<n_rows_; i++)
		for(int j=0; j<n_cols_; j++)
			transpose.v_[j*n_cols_+i] = v_[i*n_cols_+j];
	return transpose;
}